

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

int Saig_StrSimCountMatchedFlops(Aig_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 0;
  for (iVar4 = 0; iVar4 < p->nRegs; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,p->nTruePis + iVar4);
    if (p->pReprs == (Aig_Obj_t **)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (uint)(p->pReprs[*(int *)((long)pvVar2 + 0x24)] != (Aig_Obj_t *)0x0);
    }
    iVar3 = iVar3 + uVar1;
  }
  return iVar3;
}

Assistant:

int Saig_StrSimCountMatchedFlops( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Saig_ManForEachLo( p, pObj, i )
        if ( Aig_ObjRepr(p, pObj) )
            Counter++;
    return Counter;
}